

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O0

void __thiscall
Memory::HeapBlockMap32::Cleanup(HeapBlockMap32 *this,bool concurrentFindImplicitRoot)

{
  L2MapChunk *this_00;
  code *pcVar1;
  bool bVar2;
  HeapAllocator *allocator;
  undefined8 *in_FS_OFFSET;
  L2MapChunk *l2map;
  uint id1;
  bool concurrentFindImplicitRoot_local;
  HeapBlockMap32 *this_local;
  
  l2map._0_4_ = 0;
  do {
    if (0xfff < (uint)l2map) {
      return;
    }
    this_00 = this->map[(uint)l2map];
    if ((this_00 != (L2MapChunk *)0x0) && (bVar2 = L2MapChunk::IsEmpty(this_00), bVar2)) {
      this->map[(uint)l2map] = (L2MapChunk *)0x0;
      allocator = HeapAllocator::GetNoMemProtectInstance();
      DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Memory::HeapBlockMap32::L2MapChunk>
                (allocator,this_00);
      if (this->count == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *(undefined4 *)*in_FS_OFFSET = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                           ,0x49b,"(count > 0)","count > 0");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *(undefined4 *)*in_FS_OFFSET = 0;
      }
      this->count = this->count - 1;
    }
    l2map._0_4_ = (uint)l2map + 1;
  } while( true );
}

Assistant:

void
HeapBlockMap32::Cleanup(bool concurrentFindImplicitRoot)
{
    for (uint id1 = 0; id1 < L1Count; id1++)
    {
        L2MapChunk * l2map = map[id1];
        if (l2map != nullptr && l2map->IsEmpty())
        {
            // Concurrent searches for implicit roots will never see empty L2 maps.
            map[id1] = nullptr;
            NoMemProtectHeapDelete(l2map);
            Assert(count > 0);
            count--;
        }
    }
}